

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_quality.hpp
# Opt level: O2

void __thiscall
Omega_h::MetricElementQualities<3,_3>::~MetricElementQualities(MetricElementQualities<3,_3> *this)

{
  Write<double>::~Write(&(this->metrics).write_);
  Write<double>::~Write((Write<double> *)this);
  return;
}

Assistant:

MetricElementQualities(Mesh const* mesh, Reals metrics_in)
      : coords(mesh->coords()), metrics(metrics_in) {}